

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O0

bool __thiscall
cmBuildCommand::MainSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  const_reference pvVar5;
  ostream *poVar6;
  cmGlobalGenerator *this_00;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  string makecommand;
  string local_258;
  undefined4 local_234;
  string local_230;
  undefined1 local_210 [8];
  ostringstream e;
  uint local_98;
  int local_94;
  uint i;
  Doing doing;
  string target;
  char *project_name;
  char *configuration;
  char *variable;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmBuildCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"requires at least one argument naming a CMake variable",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    project_name = (char *)0x0;
    target.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)&i);
    local_94 = 0;
    for (local_98 = 1;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_20), local_98 < sVar3; local_98 = local_98 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,(ulong)local_98);
      bVar2 = std::operator==(pvVar5,"CONFIGURATION");
      if (bVar2) {
        local_94 = 1;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,(ulong)local_98);
        bVar2 = std::operator==(pvVar5,"PROJECT_NAME");
        if (bVar2) {
          local_94 = 2;
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(ulong)local_98);
          bVar2 = std::operator==(pvVar5,"TARGET");
          if (bVar2) {
            local_94 = 3;
          }
          else {
            if (local_94 == 1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,(ulong)local_98);
              project_name = (char *)std::__cxx11::string::c_str();
            }
            else if (local_94 == 2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,(ulong)local_98);
              target.field_2._8_8_ = std::__cxx11::string::c_str();
            }
            else {
              if (local_94 != 3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
                poVar6 = std::operator<<((ostream *)local_210,"unknown argument \"");
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](local_20,(ulong)local_98);
                poVar6 = std::operator<<(poVar6,(string *)pvVar5);
                std::operator<<(poVar6,"\"");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_230);
                std::__cxx11::string::~string((string *)&local_230);
                this_local._7_1_ = 0;
                local_234 = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
                goto LAB_004d373d;
              }
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(ulong)local_98);
              std::__cxx11::string::operator=((string *)&i,(string *)pvVar5);
            }
            local_94 = 0;
          }
        }
      }
    }
    if ((project_name == (char *)0x0) || (*project_name == '\0')) {
      project_name = getenv("CMAKE_CONFIG_TYPE");
    }
    if ((project_name == (char *)0x0) || (*project_name == '\0')) {
      project_name = "Release";
    }
    if ((target.field_2._8_8_ != 0) && (*(char *)target.field_2._8_8_ != '\0')) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_258,"Ignoring PROJECT_NAME option because it has no effect.",
                 (allocator *)(makecommand.field_2._M_local_buf + 0xf));
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_258,false);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)(makecommand.field_2._M_local_buf + 0xf));
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,project_name,&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"",&local_2c9);
    bVar2 = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_280,this_00,(string *)&i,&local_2a0,&local_2c8,bVar2);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,pcVar4,&local_2f1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,&local_2f0,pcVar4);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    this_local._7_1_ = 1;
    local_234 = 1;
    std::__cxx11::string::~string((string *)local_280);
LAB_004d373d:
    std::__cxx11::string::~string((string *)&i);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBuildCommand
::MainSignature(std::vector<std::string> const& args)
{
  if(args.size() < 1)
    {
    this->SetError("requires at least one argument naming a CMake variable");
    return false;
    }

  // The cmake variable in which to store the result.
  const char* variable = args[0].c_str();

  // Parse remaining arguments.
  const char* configuration = 0;
  const char* project_name = 0;
  std::string target;
  enum Doing { DoingNone, DoingConfiguration, DoingProjectName, DoingTarget };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "CONFIGURATION")
      {
      doing = DoingConfiguration;
      }
    else if(args[i] == "PROJECT_NAME")
      {
      doing = DoingProjectName;
      }
    else if(args[i] == "TARGET")
      {
      doing = DoingTarget;
      }
    else if(doing == DoingConfiguration)
      {
      doing = DoingNone;
      configuration = args[i].c_str();
      }
    else if(doing == DoingProjectName)
      {
      doing = DoingNone;
      project_name = args[i].c_str();
      }
    else if(doing == DoingTarget)
      {
      doing = DoingNone;
      target = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  // If null/empty CONFIGURATION argument, cmake --build uses 'Debug'
  // in the currently implemented multi-configuration global generators...
  // so we put this code here to end up with the same default configuration
  // as the original 2-arg build_command signature:
  //
  if(!configuration || !*configuration)
    {
    configuration = getenv("CMAKE_CONFIG_TYPE");
    }
  if(!configuration || !*configuration)
    {
    configuration = "Release";
    }

  if(project_name && *project_name)
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
      "Ignoring PROJECT_NAME option because it has no effect.");
    }

  std::string makecommand = this->Makefile->GetGlobalGenerator()
    ->GenerateCMakeBuildCommand(target, configuration, "",
                                this->Makefile->IgnoreErrorsCMP0061());

  this->Makefile->AddDefinition(variable, makecommand.c_str());

  return true;
}